

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeSingleSuccessorInfo::PathTypeSingleSuccessorInfo
          (PathTypeSingleSuccessorInfo *this,PathTypeSuccessorKey key,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef_local;
  PathTypeSingleSuccessorInfo *this_local;
  PathTypeSuccessorKey key_local;
  
  (this->successorKey).propertyId = key.propertyId;
  (this->successorKey).attributes = key.attributes;
  *(int3 *)&(this->successorKey).field_0x5 = key._5_3_;
  this_local = (PathTypeSingleSuccessorInfo *)key;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>::WriteBarrierPtr
            (&this->successorTypeWeakRef,typeWeakRef);
  bVar2 = PathTypeSuccessorKey::HasInfo((PathTypeSuccessorKey *)&this_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7e,"(key.HasInfo())","key.HasInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (typeWeakRef == (RecyclerWeakReference<Js::DynamicType> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7f,"(typeWeakRef != nullptr)","typeWeakRef != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  (this->super_PathTypeSuccessorInfo).kind = PathTypeSuccessorKindSingle;
  return;
}

Assistant:

PathTypeSingleSuccessorInfo::PathTypeSingleSuccessorInfo(const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef)
        : successorKey(key), successorTypeWeakRef(typeWeakRef)
    {
        Assert(key.HasInfo());
        Assert(typeWeakRef != nullptr);
        this->kind = PathTypeSuccessorKindSingle;
    }